

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
external_distance_sensor_message_write_read::test_method
          (external_distance_sensor_message_write_read *this)

{
  int i;
  long lVar1;
  buffer_reader *reader_00;
  const_string local_188;
  char *local_178;
  char *local_170;
  binary_expr<boost::test_tools::assertion::value_expr<double_&>,_double_&,_boost::test_tools::assertion::op::EQ<double,_double,_void>_>
  local_168;
  buffer buffer;
  lazy_ostream local_140;
  undefined1 *local_130;
  char **local_128;
  undefined1 local_120 [24];
  const_string local_108;
  const_string local_f8;
  buffer_writer writer;
  buffer_reader reader;
  external_distance_sensor_message write_msg;
  external_distance_sensor_message read_msg;
  
  for (lVar1 = 0; lVar1 != 9; lVar1 = lVar1 + 1) {
    write_msg.data._M_elems[lVar1] = (double)(int)lVar1 + 0.3;
  }
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffer_writer::buffer_writer(&writer,&buffer);
  ::operator<<(&writer,&write_msg);
  buffer_reader::buffer_reader(&reader,&buffer);
  reader_00 = &reader;
  ::operator>>(reader_00,&read_msg);
  local_f8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_f8.m_end = "";
  local_108.m_begin = "";
  local_108.m_end = "";
  for (lVar1 = 0; lVar1 != 0x48; lVar1 = lVar1 + 8) {
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)reader_00,&local_f8,0xb4,&local_108);
    local_168.m_lhs.m_value = read_msg.data._M_elems + lVar1;
    local_168.m_rhs = (double *)((long)write_msg.data._M_elems + lVar1);
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<double_&>,_double_&,_boost::test_tools::assertion::op::EQ<double,_double,_void>_>
    ::evaluate((assertion_result *)local_120,&local_168,false);
    local_178 = "read_msg.data[i] == write_msg.data[i]";
    local_170 = "";
    local_140.m_empty = false;
    local_140._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001a9520;
    local_130 = boost::unit_test::lazy_ostream::inst;
    local_128 = &local_178;
    local_188.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
    ;
    local_188.m_end = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_120,&local_140,&local_188,0xb4,CHECK,CHECK_BUILT_ASSERTION,
               0);
    reader_00 = (buffer_reader *)(local_120 + 0x10);
    boost::detail::shared_count::~shared_count((shared_count *)reader_00);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(external_distance_sensor_message_write_read)
{
    external_distance_sensor_message write_msg;
    for(int i = 0; i<9; i++){
      write_msg.data[i] = static_cast<double>(i) + 0.3;
    }

    buffer buffer;
    buffer_writer writer(buffer);
    writer << write_msg;

    external_distance_sensor_message read_msg;
    buffer_reader reader(buffer);
    reader >> read_msg;

    for(int i = 0; i<9; i++){
      BOOST_TEST(read_msg.data[i] == write_msg.data[i]);
    }
}